

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O0

void __thiscall
miyuki::serialize::OutputArchive::_save_nvp<int>(OutputArchive *this,char *name,int *value)

{
  json *pjVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  allocator<char> local_61;
  string local_60 [48];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_30;
  int *local_20;
  int *value_local;
  char *name_local;
  OutputArchive *this_local;
  
  local_20 = value;
  value_local = (int *)name;
  name_local = (char *)this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_30,(nullptr_t)0x0);
  pjVar1 = _top_abi_cxx11_(this);
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pjVar1,(char *)value_local);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(pvVar2,&local_30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_30);
  pjVar1 = _top_abi_cxx11_(this);
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pjVar1,(char *)value_local);
  _makeNode(this,pvVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"/",&local_61);
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::append((char *)local_60);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,__args);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  _save<int>(this,local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this);
  _popNode(this);
  return;
}

Assistant:

void _save_nvp(const char *name, const T &value) {
            _top()[name] = json::json();
            _makeNode(_top()[name]);
            locator.emplace_back(std::string("/").append(name));
            _save(value);
            locator.pop_back();
            _popNode();
        }